

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

uint __thiscall
capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage::allocateFromHole
          (DataLocationUsage *this,Group *group,DataLocation *location,uint lgSize)

{
  bool bVar1;
  NullableValue<unsigned_char> *other;
  uchar *puVar2;
  uint locationOffset;
  Fault f_2;
  undefined1 local_e0 [8];
  DebugComparison<unsigned_char_&,_unsigned_int_&> _kjCondition_2;
  uchar *hole;
  NullableValue<unsigned_char> _hole343;
  Fault f_1;
  undefined1 local_98 [8];
  DebugComparison<unsigned_int_&,_unsigned_int_&> _kjCondition_1;
  Fault local_60;
  Fault f;
  undefined1 local_50 [8];
  DebugComparison<unsigned_int_&,_unsigned_int_&> _kjCondition;
  uint result;
  uint lgSize_local;
  DataLocation *location_local;
  Group *group_local;
  DataLocationUsage *this_local;
  
  _kjCondition._36_4_ = lgSize;
  if ((this->isUsed & 1U) == 0) {
    f.exception = (Exception *)
                  kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                             (uint *)&_kjCondition.field_0x24);
    kj::_::DebugExpression<unsigned_int&>::operator<=
              ((DebugComparison<unsigned_int_&,_unsigned_int_&> *)local_50,
               (DebugExpression<unsigned_int&> *)&f,&location->lgSize);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int&>&,char_const(&)[46]>
                (&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                 ,0x14c,FAILED,"lgSize <= location.lgSize",
                 "_kjCondition,\"Did smallestHoleAtLeast() really find a hole?\"",
                 (DebugComparison<unsigned_int_&,_unsigned_int_&> *)local_50,
                 (char (*) [46])"Did smallestHoleAtLeast() really find a hole?");
      kj::_::Debug::Fault::fatal(&local_60);
    }
    _kjCondition.result = false;
    _kjCondition._33_3_ = 0;
    this->isUsed = true;
    this->lgSizeUsed = _kjCondition._36_1_;
  }
  else if (lgSize < this->lgSizeUsed) {
    HoleSet<unsigned_char>::tryAllocate
              ((HoleSet<unsigned_char> *)((long)&hole + 4),(char)this + '\x02');
    other = kj::_::readMaybe<unsigned_char>((Maybe<unsigned_char> *)((long)&hole + 4));
    kj::_::NullableValue<unsigned_char>::NullableValue
              ((NullableValue<unsigned_char> *)((long)&hole + 6),other);
    kj::Maybe<unsigned_char>::~Maybe((Maybe<unsigned_char> *)((long)&hole + 4));
    puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_char_
                       ((NullableValue *)((long)&hole + 6));
    if (puVar2 == (uchar *)0x0) {
      f_2.exception =
           (Exception *)
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->lgSizeUsed);
      kj::_::DebugExpression<unsigned_char&>::operator<
                ((DebugComparison<unsigned_char_&,_unsigned_int_&> *)local_e0,
                 (DebugExpression<unsigned_char&> *)&f_2,&location->lgSize);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e0);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_char&,unsigned_int&>&,char_const(&)[46]>
                  ((Fault *)&stack0xffffffffffffff10,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                   ,0x15e,FAILED,"lgSizeUsed < location.lgSize",
                   "_kjCondition,\"Did smallestHoleAtLeast() really find a hole?\"",
                   (DebugComparison<unsigned_char_&,_unsigned_int_&> *)local_e0,
                   (char (*) [46])"Did smallestHoleAtLeast() really find a hole?");
        kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff10);
      }
      _kjCondition._32_4_ = 1 << (this->lgSizeUsed - _kjCondition._36_1_ & 0x1f);
      HoleSet<unsigned_char>::addHolesAtEnd
                (&this->holes,_kjCondition._36_1_,(char)_kjCondition._32_4_ + '\x01',
                 this->lgSizeUsed);
      this->lgSizeUsed = this->lgSizeUsed + '\x01';
    }
    else {
      _kjCondition_2._32_8_ =
           kj::_::NullableValue<unsigned_char>::operator*
                     ((NullableValue<unsigned_char> *)((long)&hole + 6));
      _kjCondition._32_4_ = ZEXT14(*(byte *)_kjCondition_2._32_8_);
    }
    kj::_::NullableValue<unsigned_char>::~NullableValue
              ((NullableValue<unsigned_char> *)((long)&hole + 6));
  }
  else {
    f_1.exception =
         (Exception *)
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(uint *)&_kjCondition.field_0x24);
    kj::_::DebugExpression<unsigned_int&>::operator<
              ((DebugComparison<unsigned_int_&,_unsigned_int_&> *)local_98,
               (DebugExpression<unsigned_int&> *)&f_1,&location->lgSize);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int&>&,char_const(&)[46]>
                ((Fault *)&stack0xffffffffffffff58,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                 ,0x153,FAILED,"lgSize < location.lgSize",
                 "_kjCondition,\"Did smallestHoleAtLeast() really find a hole?\"",
                 (DebugComparison<unsigned_int_&,_unsigned_int_&> *)local_98,
                 (char (*) [46])"Did smallestHoleAtLeast() really find a hole?");
      kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff58);
    }
    HoleSet<unsigned_char>::addHolesAtEnd(&this->holes,this->lgSizeUsed,'\x01',_kjCondition._36_1_);
    this->lgSizeUsed = _kjCondition._36_1_ + '\x01';
    _kjCondition.result = true;
    _kjCondition._33_3_ = 0;
  }
  return (location->offset << ((char)location->lgSize - _kjCondition._36_1_ & 0x1fU)) +
         _kjCondition._32_4_;
}

Assistant:

uint allocateFromHole(Group& group, Union::DataLocation& location, uint lgSize) {
        // Allocate the given space from an existing hole, given smallestHoleAtLeast() already
        // returned non-null indicating such a hole exists.

        uint result;

        if (!isUsed) {
          // The location is totally unused, so just allocate from the beginning.
          KJ_DASSERT(lgSize <= location.lgSize, "Did smallestHoleAtLeast() really find a hole?");
          result = 0;
          isUsed = true;
          lgSizeUsed = lgSize;
        } else if (lgSize >= lgSizeUsed) {
          // Requested size is at least our current usage, so clearly won't fit in any holes.
          // We must expand to double the requested size, and return the second half.
          KJ_DASSERT(lgSize < location.lgSize, "Did smallestHoleAtLeast() really find a hole?");
          holes.addHolesAtEnd(lgSizeUsed, 1, lgSize);
          lgSizeUsed = lgSize + 1;
          result = 1;
        } else KJ_IF_SOME(hole, holes.tryAllocate(lgSize)) {
          // Found a hole.
          result = hole;
        } else {
          // The requested size is smaller than what we're using so far, but didn't fit in a
          // hole.  We should double our "used" size, then allocate from the new space.
          KJ_DASSERT(lgSizeUsed < location.lgSize,
                     "Did smallestHoleAtLeast() really find a hole?");
          result = 1 << (lgSizeUsed - lgSize);
          holes.addHolesAtEnd(lgSize, result + 1, lgSizeUsed);
          lgSizeUsed += 1;
        }